

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artitele.cpp
# Opt level: O2

bool __thiscall AArtiTeleport::Use(AArtiTeleport *this,bool pickup)

{
  short sVar1;
  player_t *activator;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  FPlayerStart *pFVar5;
  AActor *pAVar6;
  TObjPtr<AActor> *obj;
  FSoundID local_5c;
  double local_58;
  double dStack_50;
  DAngle local_40;
  DVector3 local_38;
  
  uVar2 = deathmatchstarts.Count;
  if (deathmatch.Value == 0) {
    pAVar6 = GC::ReadBarrier<AActor>((AActor **)&(this->super_AInventory).Owner);
    pFVar5 = G_PickPlayerStart((int)((long)(pAVar6->player[-0x3b4b].frags + 7) / 0x2a0),0);
  }
  else {
    uVar4 = FRandom::operator()(&pr_tele);
    pFVar5 = deathmatchstarts.Array + (ulong)uVar4 % (ulong)uVar2;
  }
  sVar1 = pFVar5->angle;
  obj = &(this->super_AInventory).Owner;
  local_58 = (pFVar5->pos).X;
  dStack_50 = (pFVar5->pos).Y;
  pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
  local_38.X = local_58;
  local_38.Y = dStack_50;
  local_38.Z = -2147483648.0;
  local_40.Degrees = (double)(int)sVar1;
  P_Teleport(pAVar6,&local_38,&local_40,3);
  pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
  if ((pAVar6->player->morphTics != 0) &&
     (pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj), (pAVar6->player->MorphStyle & 8) != 0)) {
    pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
    activator = pAVar6->player;
    pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
    bVar3 = P_UndoPlayerMorph(activator,pAVar6->player,8,false);
    if ((!bVar3) &&
       (pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj), (pAVar6->player->MorphStyle & 0x20) != 0))
    {
      return true;
    }
  }
  pAVar6 = GC::ReadBarrier<AActor>((AActor **)obj);
  local_5c.ID = S_FindSound("*evillaugh");
  S_Sound(pAVar6,2,&local_5c,1.0,0.0);
  return true;
}

Assistant:

bool AArtiTeleport::Use (bool pickup)
{
	DVector3 dest;
	int destAngle;

	if (deathmatch)
	{
		unsigned int selections = deathmatchstarts.Size ();
		unsigned int i = pr_tele() % selections;
		dest = deathmatchstarts[i].pos;
		destAngle = deathmatchstarts[i].angle;
	}
	else
	{
		FPlayerStart *start = G_PickPlayerStart(int(Owner->player - players));
		dest = start->pos;
		destAngle = start->angle;
	}
	dest.Z = ONFLOORZ;
	P_Teleport (Owner, dest, (double)destAngle, TELF_SOURCEFOG | TELF_DESTFOG);
	bool canlaugh = true;
 	if (Owner->player->morphTics && (Owner->player->MorphStyle & MORPH_UNDOBYCHAOSDEVICE))
 	{ // Teleporting away will undo any morph effects (pig)
		if (!P_UndoPlayerMorph (Owner->player, Owner->player, MORPH_UNDOBYCHAOSDEVICE)
			&& (Owner->player->MorphStyle & MORPH_FAILNOLAUGH))
		{
			canlaugh = false;
		}
 	}
	if (canlaugh)
 	{ // Full volume laugh
 		S_Sound (Owner, CHAN_VOICE, "*evillaugh", 1, ATTN_NONE);
 	}
	return true;
}